

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# names.cc
# Opt level: O2

string * __thiscall
upb::generator::FileWarning_abi_cxx11_
          (string *__return_storage_ptr__,generator *this,string_view filename)

{
  Arg *in_R8;
  string_view format;
  generator *local_38;
  size_t local_30;
  
  local_30 = filename._M_len;
  format._M_str = (char *)&local_38;
  format._M_len =
       (size_t)
       "/* This file was generated by upb_generator from the input file:\n *\n *     $0\n *\n * Do not edit -- your changes will be discarded when the file is\n * regenerated.\n * NO CHECKED-IN PROTOBUF GENCODE */\n\n"
  ;
  local_38 = this;
  absl::lts_20250127::Substitute_abi_cxx11_
            (__return_storage_ptr__,(lts_20250127 *)0xc9,format,in_R8);
  return __return_storage_ptr__;
}

Assistant:

std::string FileWarning(absl::string_view filename) {
  return absl::Substitute(
      "/* This file was generated by upb_generator from the input file:\n"
      " *\n"
      " *     $0\n"
      " *\n"
      " * Do not edit -- your changes will be discarded when the file is\n"
      " * regenerated.\n"
      " * NO CHECKED-IN "
      // Intentional line break.
      "PROTOBUF GENCODE */\n"
      "\n",
      filename);
}